

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp-rb.c
# Opt level: O0

void rtp_rb_clear(void)

{
  uint local_c;
  int i;
  
  rtp_rb_start = 0;
  rtp_rb_end = 0;
  rtp_rb_cnt = 0;
  for (local_c = 0; local_c < rtp_rb_size; local_c = local_c + 1) {
    rtp_pkt_init(rtp_rb + (int)local_c);
    rtp_rb[(int)local_c].length = 0;
  }
  return;
}

Assistant:

void rtp_rb_clear(void) {
  rtp_rb_start = 0;
  rtp_rb_end   = 0;
  rtp_rb_cnt   = 0;

  int i;
  for (i = 0; i < rtp_rb_size; i++) {
    rtp_pkt_init(rtp_rb + i);
    rtp_rb[i].length = 0;
  }
}